

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

int32 Js::JavascriptNativeIntArray::Pop(ScriptContext *scriptContext,Var object)

{
  code *pcVar1;
  int32 iVar2;
  bool bVar3;
  uint32 uVar4;
  ThreadContext *threadContext;
  undefined4 *puVar5;
  int32 local_58;
  uint32 local_54;
  int32 element;
  uint32 index;
  JavascriptNativeIntArray *arr;
  undefined1 local_38 [8];
  JsReentLock reentrancylock;
  Var object_local;
  ScriptContext *scriptContext_local;
  
  reentrancylock._24_8_ = object;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_38,threadContext);
  bVar3 = VarIs<Js::JavascriptNativeIntArray>((Var)reentrancylock._24_8_);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x138b,"(VarIs<JavascriptNativeIntArray>(object))",
                                "VarIs<JavascriptNativeIntArray>(object)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  _element = (JavascriptArray *)VarTo<Js::JavascriptNativeIntArray>((Var)reentrancylock._24_8_);
  uVar4 = ArrayObject::GetLength((ArrayObject *)_element);
  if (uVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x138e,"(arr->GetLength() != 0)","arr->GetLength() != 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  local_54 = (_element->super_ArrayObject).length - 1;
  local_58 = Js::JavascriptOperators::OP_GetNativeIntElementI_UInt32
                       ((Var)reentrancylock._24_8_,local_54,scriptContext);
  bVar3 = SparseArraySegment<int>::IsMissingItem(&local_58);
  if (!bVar3) {
    Js::JavascriptArray::SetLength(_element,local_54);
  }
  iVar2 = local_58;
  JsReentLock::~JsReentLock((JsReentLock *)local_38);
  return iVar2;
}

Assistant:

int32 JavascriptNativeIntArray::Pop(ScriptContext * scriptContext, Var object)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Array_NativeIntPop, reentrancylock, scriptContext->GetThreadContext());
        Assert(VarIs<JavascriptNativeIntArray>(object));
        JavascriptNativeIntArray * arr = VarTo<JavascriptNativeIntArray>(object);

        Assert(arr->GetLength() != 0);

        uint32 index = arr->length - 1;

        int32 element = Js::JavascriptOperators::OP_GetNativeIntElementI_UInt32(object, index, scriptContext);

        //If it is a missing item, then don't update the length - Pre-op Bail out will happen.
        if(!SparseArraySegment<int32>::IsMissingItem(&element))
        {
            arr->SetLength(index);
        }
        
        return element;
        JIT_HELPER_END(Array_NativeIntPop);
    }